

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O2

CURLcode hsts_create(hsts *h,char *hostname,_Bool subdomains,curl_off_t expires)

{
  size_t length;
  void *ne;
  void *pvVar1;
  CURLcode CVar2;
  
  length = strlen(hostname);
  CVar2 = CURLE_OK;
  if ((length != 0) && ((hostname[length - 1] != '.' || (length = length - 1, length != 0)))) {
    ne = (*Curl_ccalloc)(1,0x38);
    CVar2 = CURLE_OUT_OF_MEMORY;
    if (ne != (void *)0x0) {
      pvVar1 = Curl_memdup0(hostname,length);
      if (pvVar1 == (void *)0x0) {
        (*Curl_cfree)(ne);
      }
      else {
        *(void **)((long)ne + 0x20) = pvVar1;
        *(curl_off_t *)((long)ne + 0x30) = expires;
        *(_Bool *)((long)ne + 0x28) = subdomains;
        Curl_llist_append(&h->list,ne,(Curl_llist_node *)ne);
        CVar2 = CURLE_OK;
      }
    }
  }
  return CVar2;
}

Assistant:

static CURLcode hsts_create(struct hsts *h,
                            const char *hostname,
                            bool subdomains,
                            curl_off_t expires)
{
  size_t hlen;
  DEBUGASSERT(h);
  DEBUGASSERT(hostname);

  hlen = strlen(hostname);
  if(hlen && (hostname[hlen - 1] == '.'))
    /* strip off any trailing dot */
    --hlen;
  if(hlen) {
    char *duphost;
    struct stsentry *sts = calloc(1, sizeof(struct stsentry));
    if(!sts)
      return CURLE_OUT_OF_MEMORY;

    duphost = Curl_memdup0(hostname, hlen);
    if(!duphost) {
      free(sts);
      return CURLE_OUT_OF_MEMORY;
    }

    sts->host = duphost;
    sts->expires = expires;
    sts->includeSubDomains = subdomains;
    Curl_llist_append(&h->list, sts, &sts->node);
  }
  return CURLE_OK;
}